

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MomentumHistogram.cpp
# Opt level: O2

void __thiscall
OpenMD::MomentumHistogram::MomentumHistogram
          (MomentumHistogram *this,SimInfo *info,string *filename,string *sele,int nbins,
          int momentum_type,int momentum_component)

{
  SelectionEvaluator *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,nbins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__MomentumHistogram_002efad0
  ;
  std::__cxx11::string::string((string *)&this->selectionScript_,(string *)sele);
  this_00 = &this->evaluator_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  SelectionManager::SelectionManager(&this->seleMan_,info);
  this->nBins_ = nbins;
  this->mom_type_ = momentum_type;
  (this->momentumLabel_)._M_dataplus._M_p = (pointer)&(this->momentumLabel_).field_2;
  (this->momentumLabel_)._M_string_length = 0;
  (this->momentumLabel_).field_2._M_local_buf[0] = '\0';
  this->mom_comp_ = momentum_component;
  (this->componentLabel_)._M_dataplus._M_p = (pointer)&(this->componentLabel_).field_2;
  (this->componentLabel_)._M_string_length = 0;
  (this->componentLabel_).field_2._M_local_buf[0] = '\0';
  (this->bincenter_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bincenter_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bincenter_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SelectionEvaluator::loadScriptString(this_00,sele);
  if ((this->evaluator_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_70,this_00);
    SelectionManager::setSelectionSet(&this->seleMan_,(SelectionSet *)&local_70);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_70);
  }
  std::__cxx11::string::assign((char *)&this->momentumLabel_);
  std::__cxx11::string::assign((char *)&this->componentLabel_);
  getPrefix(&local_50,filename);
  std::operator+(&local_70,&local_50,".MomentumHistogram");
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

MomentumHistogram::MomentumHistogram(SimInfo* info,
                                       const std::string& filename,
                                       const std::string& sele, int nbins,
                                       int momentum_type,
                                       int momentum_component) :
      StaticAnalyser(info, filename, nbins),
      selectionScript_(sele), evaluator_(info), seleMan_(info), nBins_(nbins),
      mom_type_(momentum_type), mom_comp_(momentum_component) {
    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    switch (mom_type_) {
    case 1:
      momentumLabel_ = "Angular Momentum: J";
      break;
    case 0:
    default:
      momentumLabel_ = "Linear Momentum: P";
      break;
    }

    switch (mom_comp_) {
    case 0:
      componentLabel_ = "x";
      break;
    case 1:
      componentLabel_ = "y";
      break;
    case 2:
    default:
      componentLabel_ = "z";
      break;
    }

    setOutputName(getPrefix(filename) + ".MomentumHistogram");
  }